

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNodePtr xmlNewDocRawNode(xmlDocPtr doc,xmlNsPtr ns,xmlChar *name,xmlChar *content)

{
  _xmlNode *p_Var1;
  _xmlNode *p_Var2;
  xmlNodePtr pxVar3;
  _xmlNode *p_Var4;
  
  pxVar3 = xmlNewDocNode(doc,ns,name,(xmlChar *)0x0);
  if ((pxVar3 != (xmlNodePtr)0x0) && (pxVar3->doc = doc, content != (xmlChar *)0x0)) {
    p_Var4 = xmlNewText(content);
    if (p_Var4 == (xmlNodePtr)0x0) {
      pxVar3->children = (_xmlNode *)0x0;
      p_Var4 = (_xmlNode *)0x0;
    }
    else {
      p_Var4->doc = doc;
      pxVar3->children = p_Var4;
      p_Var2 = p_Var4->next;
      while (p_Var1 = p_Var2, p_Var1 != (_xmlNode *)0x0) {
        p_Var4->parent = pxVar3;
        p_Var4 = p_Var1;
        p_Var2 = p_Var1->next;
      }
      p_Var4->parent = pxVar3;
    }
    pxVar3->last = p_Var4;
  }
  return pxVar3;
}

Assistant:

xmlNodePtr
xmlNewDocRawNode(xmlDocPtr doc, xmlNsPtr ns,
                 const xmlChar *name, const xmlChar *content) {
    xmlNodePtr cur;

    cur = xmlNewDocNode(doc, ns, name, NULL);
    if (cur != NULL) {
        cur->doc = doc;
	if (content != NULL) {
	    cur->children = xmlNewDocText(doc, content);
	    UPDATE_LAST_CHILD_AND_PARENT(cur)
	}
    }
    return(cur);
}